

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test::TestBody
          (Parser_parseModelWithMultipleComponentHierarchyWaterfalls_Test *this)

{
  char *pcVar1;
  AssertHelper local_a0 [8];
  Message local_98 [8];
  AssertionResult gtest_ar;
  ModelPtr model;
  PrinterPtr printer;
  ParserPtr parser;
  string a;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"ignatio\"/>\n  <component name=\"dave\"/>\n  <component name=\"bob\"/>\n  <component name=\"angus\"/>\n  <component name=\"jackie\"/>\n  <component name=\"mildred\"/>\n  <component name=\"sue\"/>\n  <encapsulation>\n    <component_ref component=\"dave\">\n      <component_ref component=\"bob\">\n        <component_ref component=\"angus\"/>\n        <component_ref component=\"jackie\"/>\n      </component_ref>\n    </component_ref>\n    <component_ref component=\"mildred\">\n      <component_ref component=\"sue\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x254,pcVar1);
    testing::internal::AssertHelper::operator=(local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Parser, parseModelWithMultipleComponentHierarchyWaterfalls)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"ignatio\"/>\n"
        "  <component name=\"dave\"/>\n"
        "  <component name=\"bob\"/>\n"
        "  <component name=\"angus\"/>\n"
        "  <component name=\"jackie\"/>\n"
        "  <component name=\"mildred\"/>\n"
        "  <component name=\"sue\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"dave\">\n"
        "      <component_ref component=\"bob\">\n"
        "        <component_ref component=\"angus\"/>\n"
        "        <component_ref component=\"jackie\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "    <component_ref component=\"mildred\">\n"
        "      <component_ref component=\"sue\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}